

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O3

void __thiscall PyreNet::Perceptron::mutate_gaussian(Perceptron *this,double mean,double std)

{
  double *pdVar1;
  RandomGenerator *this_00;
  double *weight;
  double *pdVar2;
  double dVar3;
  
  this_00 = RandomGenerator::getInstance();
  pdVar1 = (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar2 = (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar2 != pdVar1; pdVar2 = pdVar2 + 1) {
    dVar3 = RandomGenerator::generate_gaussian(this_00,mean,std);
    *pdVar2 = dVar3 + *pdVar2;
  }
  return;
}

Assistant:

void Perceptron::mutate_gaussian(const double mean, const double std) {
        RandomGenerator *randomGenerator = RandomGenerator::getInstance();
        for (double &weight : this->weights) {
            weight += randomGenerator->generate_gaussian(mean, std);
        }
    }